

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O2

void __thiscall
wasm::Memory64Lowering::wrapAddress64
          (Memory64Lowering *this,Expression **ptr,Name memoryOrTableName,bool isTable)

{
  Module *this_00;
  uintptr_t uVar1;
  Table *pTVar2;
  Memory *pMVar3;
  Unary *pUVar4;
  Builder local_20;
  
  if (((*ptr)->type).id != 1) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    if (isTable) {
      pTVar2 = Module::getTable(this_00,memoryOrTableName);
      uVar1 = (pTVar2->addressType).id;
    }
    else {
      pMVar3 = Module::getMemory(this_00,memoryOrTableName);
      uVar1 = (pMVar3->addressType).id;
    }
    if (uVar1 == 3) {
      if (((*ptr)->type).id != 3) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x35,"void wasm::Memory64Lowering::wrapAddress64(Expression *&, Name, bool)")
        ;
      }
      local_20.wasm = this_00;
      pUVar4 = Builder::makeUnary(&local_20,WrapInt64,*ptr);
      *ptr = (Expression *)pUVar4;
    }
  }
  return;
}

Assistant:

void wrapAddress64(Expression*& ptr,
                     Name memoryOrTableName,
                     bool isTable = false) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    bool is64 = false;
    if (isTable) {
      is64 = module.getTable(memoryOrTableName)->is64();
    } else {
      is64 = module.getMemory(memoryOrTableName)->is64();
    }
    if (is64) {
      assert(ptr->type == Type::i64);
      ptr = Builder(module).makeUnary(UnaryOp::WrapInt64, ptr);
    }
  }